

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

MIR_reg_t get_stack_loc(gen_ctx_t gen_ctx,MIR_reg_t start_loc,MIR_type_t type,bitmap_t conflict_locs
                       ,int *slots_num_ref)

{
  int iVar1;
  MIR_reg_t MVar2;
  ulong uVar3;
  bool bVar4;
  uint uVar5;
  uint local_44;
  gen_ctx_t local_40;
  uint *local_38;
  ulong uVar6;
  
  MVar2 = 0xffffffff;
  uVar6 = 1;
  local_40 = gen_ctx;
  local_38 = (uint *)slots_num_ref;
  while( true ) {
    local_44 = (uint)uVar6;
    uVar3 = local_40->func_stack_slots_num + 0x21;
    if (uVar3 < start_loc) break;
    bVar4 = 0x21 < start_loc && type == MIR_T_LD;
    uVar5 = (uint)bVar4;
    local_44 = uVar5 + 1;
    uVar6 = (ulong)local_44;
    if (uVar3 < start_loc + bVar4) break;
    uVar3 = 0;
    do {
      if (uVar6 == uVar3) {
        if (MVar2 == 0xffffffff && (uVar5 & start_loc - 0x22) == 0) {
          MVar2 = start_loc;
        }
        break;
      }
      iVar1 = bitmap_bit_p(conflict_locs,(ulong)(start_loc + (int)uVar3));
      uVar3 = uVar3 + 1;
    } while (iVar1 == 0);
    start_loc = start_loc + 1;
  }
  if (MVar2 == 0xffffffff) {
    MVar2 = get_new_stack_slot(local_40,type,(int *)&local_44);
  }
  *local_38 = local_44;
  return MVar2;
}

Assistant:

static MIR_reg_t get_stack_loc (gen_ctx_t gen_ctx, MIR_reg_t start_loc, MIR_type_t type,
                                bitmap_t conflict_locs, int *slots_num_ref) {
  MIR_reg_t loc, curr_loc, best_loc = MIR_NON_VAR;
  int k, slots_num = 1;
  for (loc = start_loc; loc <= func_stack_slots_num + MAX_HARD_REG; loc++) {
    slots_num = target_locs_num (loc, type);
    if (target_nth_loc (loc, type, slots_num - 1) > func_stack_slots_num + MAX_HARD_REG) break;
    for (k = 0; k < slots_num; k++) {
      curr_loc = target_nth_loc (loc, type, k);
      if (bitmap_bit_p (conflict_locs, curr_loc)) break;
    }
    if (k < slots_num) continue;
    if ((loc - MAX_HARD_REG - 1) % slots_num != 0)
      continue; /* we align stack slots according to the type size */
    if (best_loc == MIR_NON_VAR) best_loc = loc;
  }
  if (best_loc == MIR_NON_VAR) best_loc = get_new_stack_slot (gen_ctx, type, &slots_num);
  *slots_num_ref = slots_num;
  return best_loc;
}